

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void * pybind11::polymorphic_type_hook_base<kratos::TestBench,_void>::get
                 (TestBench *src,type_info **type)

{
  _func_int *local_38;
  type_info *local_28;
  type_info **type_local;
  TestBench *src_local;
  
  if (src == (TestBench *)0x0) {
    local_28 = (type_info *)0x0;
  }
  else {
    if (src == (TestBench *)0x0) {
      __cxa_bad_typeid();
    }
    local_28 = (type_info *)(src->super_Generator).super_IRNode._vptr_IRNode[-1];
  }
  *type = local_28;
  if (src == (TestBench *)0x0) {
    local_38 = (_func_int *)0x0;
  }
  else {
    local_38 = (_func_int *)
               ((long)&(src->super_Generator).super_IRNode._vptr_IRNode +
               (long)(src->super_Generator).super_IRNode._vptr_IRNode[-2]);
  }
  return local_38;
}

Assistant:

static const void *get(const itype *src, const std::type_info*& type) {
        type = src ? &typeid(*src) : nullptr;
        return dynamic_cast<const void*>(src);
    }